

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_doing(connectdata *conn,_Bool *dophase_done)

{
  CURLcode local_1c;
  CURLcode result;
  _Bool *dophase_done_local;
  connectdata *conn_local;
  
  local_1c = ftp_multi_statemach(conn,dophase_done);
  if ((local_1c == CURLE_OK) && ((*dophase_done & 1U) != 0)) {
    local_1c = ftp_dophase_done(conn,false);
  }
  return local_1c;
}

Assistant:

static CURLcode ftp_doing(struct connectdata *conn,
                          bool *dophase_done)
{
  CURLcode result = ftp_multi_statemach(conn, dophase_done);

  if(result)
    DEBUGF(infof(conn->data, "DO phase failed\n"));
  else if(*dophase_done) {
    result = ftp_dophase_done(conn, FALSE /* not connected */);

    DEBUGF(infof(conn->data, "DO phase is complete2\n"));
  }
  return result;
}